

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_for_update.c
# Opt level: O3

lu_int basiclu_solve_for_update
                 (lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                 lu_int *Wi,double *Wx,lu_int nzrhs,lu_int *irhs,double *xrhs,lu_int *p_nzlhs,
                 lu_int *ilhs,double *lhs,char trans)

{
  bool bVar1;
  lu_int lVar2;
  int iVar3;
  lu_int *plVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  lu this;
  
  plVar4 = Li;
  lVar2 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar2 != 0) {
    return lVar2;
  }
  auVar6._0_4_ = -(uint)(Li == (lu_int *)0x0);
  auVar6._4_4_ = -(uint)(Lx == (double *)0x0);
  auVar6._8_4_ = -(uint)(Ui == (lu_int *)0x0);
  auVar6._12_4_ = -(uint)(Ux == (double *)0x0);
  iVar3 = movmskps((int)plVar4,auVar6);
  lVar2 = -3;
  if ((((iVar3 == 0) && (Wi != (lu_int *)0x0)) && (Wx != (double *)0x0)) &&
     ((irhs != (lu_int *)0x0 && (xrhs != (double *)0x0 || (trans & 0xdfU) == 0x54)))) {
    if (this.nupdate < 0) {
      lVar2 = -2;
    }
    else {
      lVar2 = -5;
      if (this.nforrest != this.m) {
        if ((trans & 0xdfU) == 0x54) {
          lVar2 = -4;
          if (*irhs < 0 || this.m <= *irhs) goto LAB_003b3caa;
        }
        else {
          if (nzrhs < 1 || this.m < nzrhs) {
            bVar1 = -1 < nzrhs && nzrhs <= this.m;
          }
          else {
            uVar5 = 1;
            do {
              bVar1 = irhs[uVar5 - 1] < this.m && -1 < irhs[uVar5 - 1];
              if ((uint)nzrhs <= uVar5) break;
              uVar5 = uVar5 + 1;
            } while (bVar1);
          }
          lVar2 = -4;
          if (!bVar1) goto LAB_003b3caa;
        }
        lVar2 = lu_solve_for_update(&this,nzrhs,irhs,xrhs,p_nzlhs,ilhs,lhs,trans);
      }
    }
  }
LAB_003b3caa:
  lVar2 = lu_save(&this,istore,xstore,lVar2);
  return lVar2;
}

Assistant:

lu_int basiclu_solve_for_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int nzrhs,
    const lu_int irhs[],
    const double xrhs[],
    lu_int *p_nzlhs,
    lu_int ilhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status, n, ok;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && irhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (trans != 't' && trans != 'T' && !xrhs)
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else if (this.nforrest == this.m)
    {
        status = BASICLU_ERROR_maximum_updates;
    }
    else
    {
        /* check RHS indices */
        if (trans == 't' || trans == 'T')
        {
            ok = irhs[0] >= 0 && irhs[0] < this.m;
        }
        else
        {
            ok = nzrhs >= 0 && nzrhs <= this.m;
            for (n = 0; n < nzrhs && ok; n++)
            {
                ok = ok && irhs[n] >= 0 && irhs[n] < this.m;
            }
        }
        if (!ok)
            status = BASICLU_ERROR_invalid_argument;
    }

    if (status == BASICLU_OK)
    {
        /* may request reallocation */
        status = lu_solve_for_update(&this, nzrhs, irhs, xrhs, p_nzlhs, ilhs,
                                     lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}